

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

gravity_value_t convert_value2string(gravity_vm *vm,gravity_value_t v)

{
  _Bool _Var1;
  gravity_class_t *c;
  gravity_closure_t *pgVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 list_00;
  gravity_class_t *pgVar3;
  char *pcVar4;
  gravity_value_t gVar5;
  gravity_class_t *local_ab0;
  gravity_value_t result;
  char *identifier_3;
  char buffer_4 [512];
  char *s;
  gravity_delegate_t *pgStack_880;
  uint32_t len;
  gravity_delegate_t *delegate;
  gravity_instance_t *instance;
  gravity_closure_t *closure;
  char buffer_3 [512];
  char buffer_2 [512];
  gravity_range_t *r;
  gravity_map_t *map;
  gravity_list_t *list;
  char *identifier_2;
  char *identifier_1;
  char *identifier;
  char buffer_1 [512];
  char buffer [512];
  gravity_vm *vm_local;
  gravity_value_t v_local;
  
  list_00 = v.field_1;
  pgVar3 = v.isa;
  unique0x100004d6 = v;
  if (pgVar3 != gravity_class_string) {
    if (pgVar3 == gravity_class_int) {
      snprintf(buffer_1 + 0x1f8,0x200,"%ld",list_00.n);
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,buffer_1 + 0x1f8,0xffffffff);
    }
    else if (pgVar3 == gravity_class_bool) {
      pcVar4 = "false";
      if ((gravity_list_t *)list_00.n != (gravity_list_t *)0x0) {
        pcVar4 = "true";
      }
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,pcVar4,0xffffffff);
    }
    else if ((pgVar3 == gravity_class_null) &&
            ((gravity_list_t *)list_00.n == (gravity_list_t *)0x0)) {
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,"null",0xffffffff);
    }
    else if ((pgVar3 == gravity_class_null) &&
            ((gravity_list_t *)list_00.n == (gravity_list_t *)0x1)) {
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,"undefined",0xffffffff);
    }
    else if (pgVar3 == gravity_class_float) {
      snprintf((char *)&identifier,0x200,"%g",list_00.n);
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,(char *)&identifier,0xffffffff);
    }
    else if (pgVar3 == gravity_class_class) {
      identifier_1 = (list_00.p)->identifier;
      if (identifier_1 == (char *)0x0) {
        identifier_1 = "anonymous class";
      }
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,identifier_1,0xffffffff);
    }
    else if (pgVar3 == gravity_class_function) {
      identifier_2 = (list_00.p)->identifier;
      if (identifier_2 == (char *)0x0) {
        identifier_2 = "anonymous func";
      }
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,identifier_2,0xffffffff);
    }
    else if (pgVar3 == gravity_class_closure) {
      list = *(gravity_list_t **)((list_00.p)->identifier + 0x38);
      if (list == (gravity_list_t *)0x0) {
        list = (gravity_list_t *)anon_var_dwarf_c72b;
      }
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,(char *)list,0xffffffff);
    }
    else if (pgVar3 == gravity_class_list) {
      join_0x00000010_0x00000000_ = convert_list2string(vm,(gravity_list_t *)list_00.p);
    }
    else if (pgVar3 == gravity_class_map) {
      join_0x00000010_0x00000000_ = convert_map2string(vm,(gravity_map_t *)list_00.p);
    }
    else if (pgVar3 == gravity_class_range) {
      snprintf(buffer_3 + 0x1f8,0x200,"%ld...%ld",((gravity_value_r *)&(list_00.p)->objclass)->n,
               (list_00.p)->identifier);
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,buffer_3 + 0x1f8,0xffffffff);
    }
    else if (pgVar3 == gravity_class_fiber) {
      snprintf((char *)&closure,0x200,"Fiber %p",list_00.n);
      join_0x00000010_0x00000000_ = gravity_string_to_value(vm,(char *)&closure,0xffffffff);
    }
    else {
      c = gravity_value_getclass(v);
      instance = (gravity_instance_t *)gravity_vm_fastlookup(vm,c,0x1c);
      if (((gravity_closure_t *)instance == (gravity_closure_t *)0x0) ||
         (((((gravity_closure_t *)instance)->f->tag == EXEC_TYPE_INTERNAL &&
           ((code *)(((gravity_closure_t *)instance)->f->field_9).field_0.cpool.n ==
            convert_object_string)) ||
          (pgVar2 = gravity_vm_getclosure(vm), pgVar2 == (gravity_closure_t *)instance)))) {
        if (pgVar3 == gravity_class_instance) {
          delegate = (gravity_delegate_t *)list_00.n;
          if ((vm == (gravity_vm *)0x0) || ((list_00.p)->identifier == (char *)0x0)) {
            result.field_1 =
                 *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                  (((gravity_value_r *)&(list_00.p)->objclass)->n + 0x38);
            if (result.field_1.n == 0) {
              result.field_1.f = (gravity_float_t)anon_var_dwarf_c6fd;
            }
            snprintf((char *)&identifier_3,0x200,"instance of %s (%p)",result.field_1.n,list_00.n);
            gVar5 = gravity_string_to_value(vm,(char *)&identifier_3,0xffffffff);
            return gVar5;
          }
          pgStack_880 = gravity_vm_delegate(vm);
          if (pgStack_880->bridge_string != (gravity_bridge_string)0x0) {
            s._4_4_ = 0;
            pcVar4 = (*pgStack_880->bridge_string)
                               (vm,delegate->type_callback,(uint32_t *)((long)&s + 4));
            if (pcVar4 != (char *)0x0) {
              gVar5 = gravity_string_to_value(vm,pcVar4,s._4_4_);
              return gVar5;
            }
          }
        }
        stack0xffffffffffffffe8 = (gravity_value_t)ZEXT816(0);
      }
      else {
        _Var1 = gravity_vm_runclosure(vm,(gravity_closure_t *)instance,v,(gravity_value_t *)0x0,0);
        if (_Var1) {
          join_0x00000010_0x00000000_ = gravity_vm_result(vm);
          local_ab0 = v_local.field_1;
          if (local_ab0 != gravity_class_string) {
            join_0x00000010_0x00000000_ = gravity_string_to_value(vm,"null",0xffffffff);
          }
        }
        else {
          stack0xffffffffffffffe8 = (gravity_value_t)ZEXT816(0);
        }
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

inline gravity_value_t convert_value2string (gravity_vm *vm, gravity_value_t v) {
    if (VALUE_ISA_STRING(v)) return v;

    // handle conversion for basic classes
    if (VALUE_ISA_INT(v)) {
        char buffer[512];
        #if GRAVITY_ENABLE_INT64
        snprintf(buffer, sizeof(buffer), "%" PRId64, v.n);
        #else
        snprintf(buffer, sizeof(buffer), "%d", v.n);
        #endif
        return VALUE_FROM_CSTRING(vm, buffer);

    }
    if (VALUE_ISA_BOOL(v)) return VALUE_FROM_CSTRING(vm, (v.n) ? "true" : "false");
    if (VALUE_ISA_NULL(v)) return VALUE_FROM_CSTRING(vm, "null");
    if (VALUE_ISA_UNDEFINED(v)) return VALUE_FROM_CSTRING(vm, "undefined");
    
    if (VALUE_ISA_FLOAT(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%g", v.f);
        return VALUE_FROM_CSTRING(vm, buffer);
    }

    if (VALUE_ISA_CLASS(v)) {
        const char *identifier = (VALUE_AS_CLASS(v)->identifier);
        if (!identifier) identifier = "anonymous class";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_FUNCTION(v)) {
        const char *identifier = (VALUE_AS_FUNCTION(v)->identifier);
        if (!identifier) identifier = "anonymous func";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_CLOSURE(v)) {
        const char *identifier = (VALUE_AS_CLOSURE(v)->f->identifier);
        if (!identifier) identifier = "anonymous closure";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_LIST(v)) {
        gravity_list_t *list = VALUE_AS_LIST(v);
        return convert_list2string(vm, list);
    }

    if (VALUE_ISA_MAP(v)) {
        gravity_map_t *map = VALUE_AS_MAP(v);
        return convert_map2string(vm, map);
    }

    if (VALUE_ISA_RANGE(v)) {
        gravity_range_t *r = VALUE_AS_RANGE(v);
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%" PRId64 "...%" PRId64, r->from, r->to);
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    if (VALUE_ISA_FIBER(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "Fiber %p", VALUE_AS_OBJECT(v));
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    // check if class implements the String method (avoiding infinite loop by checking for convert_object_string)
    gravity_closure_t *closure = gravity_vm_fastlookup(vm, gravity_value_getclass(v), GRAVITY_STRING_INDEX);

    // sanity check (and break recursion)
    if ((!closure) || ((closure->f->tag == EXEC_TYPE_INTERNAL) && (closure->f->internal == convert_object_string)) || gravity_vm_getclosure(vm) == closure) {
		if (VALUE_ISA_INSTANCE(v)) {
			gravity_instance_t *instance = VALUE_AS_INSTANCE(v);
			if (vm && instance->xdata) {
				gravity_delegate_t *delegate = gravity_vm_delegate(vm);
				if (delegate->bridge_string) {
					uint32_t len = 0;
					const char *s = delegate->bridge_string(vm, instance->xdata, &len);
					if (s) return VALUE_FROM_STRING(vm, s, len);
				}
			} else {
				char buffer[512];
                const char *identifier = (instance->objclass->identifier);
                if (!identifier) identifier = "anonymous class";
                snprintf(buffer, sizeof(buffer), "instance of %s (%p)", identifier, instance);
                return VALUE_FROM_CSTRING(vm, buffer);
            }
        }
        return VALUE_FROM_ERROR(NULL);
    }

    // execute closure and return its value
    if (gravity_vm_runclosure(vm, closure, v, NULL, 0)) {
        gravity_value_t result = gravity_vm_result(vm);
        // sanity check closure return value because sometimes nil is returned by an objc instance (for example NSData String)
        if (!VALUE_ISA_STRING(result)) return VALUE_FROM_CSTRING(vm, "null");
        return result;
    }

    return VALUE_FROM_ERROR(NULL);
}